

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserCreateView.cpp
# Opt level: O2

void __thiscall UserCreateView::display(UserCreateView *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  UserCreateUpdateForm *this_00;
  undefined4 extraout_var;
  Controller *this_01;
  View *pVVar4;
  string password;
  string email;
  string lastName;
  string firstName;
  BaseUser user;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  BaseUser local_108;
  
  std::operator<<((ostream *)&std::cout,"To create a new user fill in the details asked below: \n");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"First name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator<<((ostream *)&std::cout,"Last name: ");
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_188,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator<<((ostream *)&std::cout,"Email: ");
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator<<((ostream *)&std::cout,"Password: ");
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator<<((ostream *)&std::cout,"Should this user be an admin? (y/n): ");
  cVar1 = Input::getChar();
  this_00 = (UserCreateUpdateForm *)operator_new(0xb0);
  UserCreateUpdateForm::UserCreateUpdateForm
            (this_00,&local_168,&local_188,&local_1a8,&local_1c8,cVar1 == 'y',(BaseUser *)0x0);
  (this->super_CreateView<BaseUser>).form = (ModelForm<BaseUser> *)this_00;
  bVar2 = Form::isValid((Form *)this_00);
  if (bVar2) {
    iVar3 = (*(((this->super_CreateView<BaseUser>).form)->super_Form)._vptr_Form[1])();
    local_108.super_Model<BaseUser>.id = *(int *)(CONCAT44(extraout_var,iVar3) + 8);
    local_108.super_Model<BaseUser>._vptr_Model = (_func_int **)&PTR_save_0012bc88;
    memcpy(&local_108.super_Model<BaseUser>.field_0xc,(void *)(CONCAT44(extraout_var,iVar3) + 0xc),
           0xe1);
    BaseUser::getFullName_abi_cxx11_(&local_148,&local_108);
    std::operator+(&local_128,"New user, ",&local_148);
    std::operator+(&local_1e8,&local_128," saved successfully.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  else {
    Form::printErrors(&((this->super_CreateView<BaseUser>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  std::__cxx11::string::string((string *)&local_108,"admin-panel",(allocator *)&local_1e8);
  pVVar4 = Controller::getView(this_01,(string *)&local_108);
  View::response->view = pVVar4;
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  return;
}

Assistant:

void UserCreateView::display() {
    cout << "To create a new user fill in the details asked below: \n";
    string firstName, lastName, email, password;
    bool adminStatus;
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Email: ";
    email = Input::getEmail();
    cout << "Password: ";
    password = Input::getPassword();
    cout << "Should this user be an admin? (y/n): ";
    adminStatus = (Input::getChar() == 'y');
    form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus);
    if (form->isValid()) {
        BaseUser user = form->save();
        cout << "New user, " + user.getFullName() + " saved successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}